

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
          (cmGeneratorExpressionDAGChecker *this,cmListFileBacktrace *backtrace,
          cmGeneratorTarget *target,string *property,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  
  this->Parent = parent;
  this->Target = target;
  paVar1 = &(this->Property).field_2;
  (this->Property)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (property->_M_dataplus)._M_p;
  paVar2 = &property->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&property->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Property).field_2 + 8) = uVar6;
  }
  else {
    (this->Property)._M_dataplus._M_p = pcVar4;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Property)._M_string_length = property->_M_string_length;
  (property->_M_dataplus)._M_p = (pointer)paVar2;
  property->_M_string_length = 0;
  (property->field_2)._M_local_buf[0] = '\0';
  p_Var3 = &(this->Seen)._M_t._M_impl.super__Rb_tree_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Content = content;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (backtrace->TopEntry).
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = (backtrace->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (backtrace->TopEntry).
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var5;
  (backtrace->TopEntry).
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->TransitivePropertiesOnly = false;
  Initialize(this);
  return;
}

Assistant:

cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker(
  cmListFileBacktrace backtrace, cmGeneratorTarget const* target,
  std::string property, const GeneratorExpressionContent* content,
  cmGeneratorExpressionDAGChecker* parent)
  : Parent(parent)
  , Target(target)
  , Property(std::move(property))
  , Content(content)
  , Backtrace(std::move(backtrace))
  , TransitivePropertiesOnly(false)
{
  Initialize();
}